

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void __thiscall
SPSUnit::insertHrdData
          (SPSUnit *this,int bitPos,int nal_hrd_len,int vcl_hrd_len,bool addVuiHeader,
          HRDParams *params)

{
  uint8_t *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint8_t *__dest;
  int iVar5;
  uint local_88;
  int local_84;
  uint bitRest;
  int i_1;
  int i;
  uint tmpVal;
  BitStreamWriter writer;
  BitStreamReader reader;
  int beforeBytes;
  uint8_t *newNalBuffer;
  HRDParams *params_local;
  bool addVuiHeader_local;
  int vcl_hrd_len_local;
  int nal_hrd_len_local;
  int bitPos_local;
  SPSUnit *this_local;
  
  __dest = (uint8_t *)operator_new__((ulong)((this->super_NALUnit).m_nalBufferLen + 0x40));
  iVar5 = bitPos >> 3;
  memcpy(__dest,(this->super_NALUnit).m_nalBuffer,(ulong)(this->super_NALUnit).m_nalBufferLen);
  BitStreamReader::BitStreamReader((BitStreamReader *)&writer.m_curVal);
  BitStreamReader::setBuffer
            ((BitStreamReader *)&writer.m_curVal,(this->super_NALUnit).m_nalBuffer + iVar5,
             (this->super_NALUnit).m_nalBuffer + (this->super_NALUnit).m_nalBufferLen);
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)&i);
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)&i,__dest + iVar5,
             __dest + (ulong)(this->super_NALUnit).m_nalBufferLen + 0x40);
  uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,bitPos & 7);
  BitStreamWriter::putBits((BitStreamWriter *)&i,bitPos & 7,uVar3);
  if (addVuiHeader) {
    BitStreamReader::skipBit((BitStreamReader *)&writer.m_curVal);
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    BitStreamWriter::putBit((BitStreamWriter *)&i,0);
    BitStreamWriter::putBit((BitStreamWriter *)&i,0);
    BitStreamWriter::putBit((BitStreamWriter *)&i,0);
    BitStreamWriter::putBit((BitStreamWriter *)&i,0);
    this->timing_info_present_flag = 1;
    this->fixed_frame_rate_flag = 1;
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    BitStreamWriter::putBits((BitStreamWriter *)&i,0x20,this->num_units_in_tick);
    BitStreamWriter::putBits((BitStreamWriter *)&i,0x20,this->time_scale);
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    serializeHRDParameters((BitStreamWriter *)&i,&this->nalHrdParams);
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    serializeHRDParameters((BitStreamWriter *)&i,&this->nalHrdParams);
    BitStreamWriter::putBit((BitStreamWriter *)&i,this->low_delay_hrd_flag);
    BitStreamWriter::putBit((BitStreamWriter *)&i,0);
    BitStreamWriter::putBit((BitStreamWriter *)&i,0);
  }
  else {
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    bVar2 = BitStreamReader::getBit((BitStreamReader *)&writer.m_curVal);
    if (bVar2) {
      for (bitRest = 0; (int)bitRest < nal_hrd_len / 0x20; bitRest = bitRest + 1) {
        uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,0x20);
        BitStreamWriter::putBits((BitStreamWriter *)&i,0x20,uVar3);
      }
      uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,nal_hrd_len % 0x20);
      BitStreamWriter::putBits((BitStreamWriter *)&i,nal_hrd_len % 0x20,uVar3);
    }
    else {
      serializeHRDParameters((BitStreamWriter *)&i,params);
    }
    BitStreamWriter::putBit((BitStreamWriter *)&i,1);
    bVar2 = BitStreamReader::getBit((BitStreamReader *)&writer.m_curVal);
    if (bVar2) {
      for (local_84 = 0; local_84 < vcl_hrd_len / 0x20; local_84 = local_84 + 1) {
        uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,0x20);
        BitStreamWriter::putBits((BitStreamWriter *)&i,0x20,uVar3);
      }
      uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,vcl_hrd_len % 0x20);
      BitStreamWriter::putBits((BitStreamWriter *)&i,vcl_hrd_len % 0x20,uVar3);
    }
    else {
      serializeHRDParameters((BitStreamWriter *)&i,params);
    }
    if ((nal_hrd_len == 0) && (vcl_hrd_len == 0)) {
      BitStreamWriter::putBit((BitStreamWriter *)&i,this->low_delay_hrd_flag);
    }
  }
  uVar3 = this->full_sps_bit_len;
  iVar4 = BitStreamReader::getBitsCount((BitStreamReader *)&writer.m_curVal);
  for (local_88 = (uVar3 - iVar4) + iVar5 * -8; 7 < local_88; local_88 = local_88 - 8) {
    uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,8);
    BitStreamWriter::putBits((BitStreamWriter *)&i,8,uVar3);
  }
  if (local_88 != 0) {
    uVar3 = BitStreamReader::getBits((BitStreamReader *)&writer.m_curVal,local_88);
    BitStreamWriter::putBits((BitStreamWriter *)&i,local_88,uVar3);
  }
  iVar4 = BitStreamWriter::getBitsCount((BitStreamWriter *)&i);
  this->full_sps_bit_len = iVar4 + iVar5 * 8;
  NALUnit::write_rbsp_trailing_bits((BitStreamWriter *)&i);
  BitStreamWriter::flushBits((BitStreamWriter *)&i);
  iVar4 = BitStreamWriter::getBitsCount((BitStreamWriter *)&i);
  (this->super_NALUnit).m_nalBufferLen = iVar4 / 8 + iVar5;
  puVar1 = (this->super_NALUnit).m_nalBuffer;
  if (puVar1 != (uint8_t *)0x0) {
    operator_delete__(puVar1);
  }
  (this->super_NALUnit).m_nalBuffer = __dest;
  return;
}

Assistant:

void SPSUnit::insertHrdData(const int bitPos, const int nal_hrd_len, const int vcl_hrd_len, const bool addVuiHeader,
                            const HRDParams& params)
{
    // replace hrd parameters not implemented. only insert
    static constexpr int EXTRA_SPACE = 64;

    const auto newNalBuffer = new uint8_t[m_nalBufferLen + EXTRA_SPACE];

    const int beforeBytes = bitPos >> 3;
    memcpy(newNalBuffer, m_nalBuffer, m_nalBufferLen);

    BitStreamReader reader{};
    reader.setBuffer(m_nalBuffer + beforeBytes, m_nalBuffer + m_nalBufferLen);
    BitStreamWriter writer{};
    writer.setBuffer(newNalBuffer + beforeBytes, newNalBuffer + m_nalBufferLen + EXTRA_SPACE);
    unsigned tmpVal = reader.getBits(bitPos & 7);
    writer.putBits(bitPos & 7, tmpVal);

    if (addVuiHeader)
    {
        reader.skipBit();  // old vui present header
        writer.putBit(1);  // enable vui parameters
        writer.putBit(0);  // no aspect ratio info
        writer.putBit(0);  // overscan_info_present_flag
        writer.putBit(0);  // video_signal_type_present_flag
        writer.putBit(0);  // chroma_loc_info_present_flag

        timing_info_present_flag = 1;
        fixed_frame_rate_flag = 1;
        writer.putBit(1);  // timing info present flag
        writer.putBits(32, num_units_in_tick);
        writer.putBits(32, time_scale);
        writer.putBit(1);  // fixed framerate flag

        writer.putBit(1);  // enable nal_hrd_params flags here
        serializeHRDParameters(writer, nalHrdParams);

        writer.putBit(1);  // enable vcl_hrd_params flags here
        serializeHRDParameters(writer, nalHrdParams);

        writer.putBit(low_delay_hrd_flag);
        writer.putBit(0);  // pic_struct_present_flag
        writer.putBit(0);  // bitstream_restriction_flag
    }
    else
    {
        writer.putBit(1);  // enable nal_hrd_params flags here
        if (reader.getBit())
        {  // source nal_hrd_parameters_present_flag
            // nal hrd already exists, copy from a source stream
            for (int i = 0; i < nal_hrd_len / 32; ++i) writer.putBits(32, reader.getBits(32));
            writer.putBits(nal_hrd_len % 32, reader.getBits(nal_hrd_len % 32));
        }
        else
        {
            serializeHRDParameters(writer, params);
        }

        writer.putBit(1);  // enable nal_vcl_params flags here
        if (reader.getBit())
        {  // source vcl_hrd_parameters_present_flag
            // vcl hrd already exists, copy from a source stream
            for (int i = 0; i < vcl_hrd_len / 32; ++i) writer.putBits(32, reader.getBits(32));
            writer.putBits(vcl_hrd_len % 32, reader.getBits(vcl_hrd_len % 32));
        }
        else
        {
            serializeHRDParameters(writer, params);
        }

        if (nal_hrd_len == 0 && vcl_hrd_len == 0)
            writer.putBit(low_delay_hrd_flag);  // absent in the source stream, add
    }

    // copy end of SPS
    unsigned bitRest = full_sps_bit_len - reader.getBitsCount() - beforeBytes * 8;
    for (; bitRest >= 8; bitRest -= 8)
    {
        tmpVal = reader.getBits(8);
        writer.putBits(8, tmpVal);
    }
    if (bitRest > 0)
    {
        tmpVal = reader.getBits(bitRest);
        writer.putBits(bitRest, tmpVal);
    }

    full_sps_bit_len = writer.getBitsCount() + beforeBytes * 8;

    write_rbsp_trailing_bits(writer);
    writer.flushBits();
    m_nalBufferLen = writer.getBitsCount() / 8 + beforeBytes;

    delete[] m_nalBuffer;
    m_nalBuffer = newNalBuffer;
}